

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Igatherv(void *sendbuf,int sendcount,MPIABI_Datatype sendtype,void *recvbuf,
                   int *recvcounts,int *displs,MPIABI_Datatype recvtype,int root,MPIABI_Comm comm,
                   MPIABI_Request *request)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  ompi_datatype_t *poVar5;
  ompi_datatype_t *poVar6;
  ompi_communicator_t *poVar7;
  ompi_request_t **ppoVar8;
  WPI_HandlePtr<ompi_request_t_*> local_68;
  WPI_Handle local_60 [8];
  WPI_Handle local_58 [8];
  WPI_Handle local_50 [8];
  int *local_48;
  int *displs_local;
  int *recvcounts_local;
  void *recvbuf_local;
  MPIABI_Datatype sendtype_local;
  void *pvStack_20;
  int sendcount_local;
  void *sendbuf_local;
  
  local_48 = displs;
  displs_local = recvcounts;
  recvcounts_local = (int *)recvbuf;
  recvbuf_local = (void *)sendtype;
  sendtype_local._4_4_ = sendcount;
  pvStack_20 = sendbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_50,sendtype);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_50);
  piVar3 = recvcounts_local;
  piVar2 = displs_local;
  piVar1 = local_48;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_58,recvtype);
  poVar6 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_58);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_60,comm);
  poVar7 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_60);
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_68,request);
  ppoVar8 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_68);
  iVar4 = MPI_Igatherv(sendbuf,sendcount,poVar5,piVar3,piVar2,piVar1,poVar6,root,poVar7,ppoVar8);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_68);
  return iVar4;
}

Assistant:

int MPIABI_Igatherv(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * displs,
  MPIABI_Datatype recvtype,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Igatherv(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcounts,
    displs,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}